

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::numparse::impl::AffixPatternMatcher::getPattern
          (UnicodeString *__return_storage_ptr__,AffixPatternMatcher *this)

{
  AffixPatternMatcher *this_local;
  
  CompactUnicodeString<4>::toAliasedUnicodeString(__return_storage_ptr__,&this->fPattern);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString AffixPatternMatcher::getPattern() const {
    return fPattern.toAliasedUnicodeString();
}